

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O0

int GetVersionSeanet(SEANET *pSeanet)

{
  int iVar1;
  int local_4c;
  uchar local_48 [4];
  int nbdatabytes;
  uchar databuf [25];
  uint8 local_26 [8];
  uchar reqbuf [14];
  SEANET *pSeanet_local;
  
  builtin_memcpy(local_26,"@0008\b",7);
  local_26[7] = 0xff;
  reqbuf[0] = '\x02';
  reqbuf[1] = '\x03';
  reqbuf[2] = '\x17';
  reqbuf[3] = 0x80;
  reqbuf[4] = '\x02';
  reqbuf[5] = '\n';
  local_4c = 0;
  reqbuf._6_8_ = pSeanet;
  iVar1 = WriteAllRS232Port(&pSeanet->RS232Port,local_26,0xe);
  if (iVar1 == 0) {
    memset(local_48,0,0x19);
    local_4c = 0;
    iVar1 = GetLatestMsgSeanet((SEANET *)reqbuf._6_8_,1,local_48,0x19,&local_4c);
    if (iVar1 == 0) {
      pSeanet_local._4_4_ = 0;
    }
    else {
      printf("A Seanet is not responding correctly. \n");
      pSeanet_local._4_4_ = 1;
    }
  }
  else {
    printf("Error writing data to a Seanet. \n");
    pSeanet_local._4_4_ = 1;
  }
  return pSeanet_local._4_4_;
}

Assistant:

inline int GetVersionSeanet(SEANET* pSeanet)
{
	unsigned char reqbuf[] = {MESSAGE_HEADER_SEANET,'0','0','0','8',0x08,0x00,
		SERIAL_PORT_PROGRAM_NODE_NUMBER_SEANET,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,
		0x03,mtSendVersion,0x80,SERIAL_PORT_SONAR_NODE_NUMBER_SEANET,MESSAGE_TERMINATOR_SEANET};
	unsigned char databuf[25];
	int nbdatabytes = 0;

	// Send mtSendVersion message.
	if (WriteAllRS232Port(&pSeanet->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a Seanet. \n");
		return EXIT_FAILURE;
	}

	// Wait for a mtVersionData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	if (GetLatestMsgSeanet(pSeanet, mtVersionData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	return EXIT_SUCCESS;
}